

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O3

void jpeg_write_coefficients(j_compress_ptr cinfo,jvirt_barray_ptr *coef_arrays)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_c_coef_controller *pjVar3;
  void *__s;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  
  iVar1 = cinfo->global_state;
  if (iVar1 != 100) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  jpeg_suppress_tables(cinfo,0);
  (*cinfo->err->reset_error_mgr)((j_common_ptr)cinfo);
  (*cinfo->dest->init_destination)(cinfo);
  jinit_c_master_control(cinfo,1);
  if (cinfo->arith_code == 0) {
    jinit_huff_encoder(cinfo);
  }
  else {
    jinit_arith_encoder(cinfo);
  }
  pjVar3 = (jpeg_c_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x78);
  cinfo->coef = pjVar3;
  pjVar3->start_pass = start_pass_coef;
  pjVar3->compress_data = compress_output;
  pjVar3[2].start_pass = (_func_void_j_compress_ptr_J_BUF_MODE *)coef_arrays;
  __s = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
  memset(__s,0,0x500);
  lVar5 = 0;
  lVar6 = 1;
  lVar4 = 5;
  auVar7._8_4_ = (int)__s;
  auVar7._0_8_ = __s;
  auVar7._12_4_ = (int)((ulong)__s >> 0x20);
  do {
    (&pjVar3->start_pass)[lVar4] =
         (_func_void_j_compress_ptr_J_BUF_MODE *)(lVar5 * 0x80 + (long)__s);
    (&pjVar3->start_pass + lVar4)[1] =
         (_func_void_j_compress_ptr_J_BUF_MODE *)(lVar6 * 0x80 + auVar7._8_8_);
    lVar5 = lVar5 + 2;
    lVar6 = lVar6 + 2;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0xf);
  jinit_marker_writer(cinfo);
  (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
  (*cinfo->marker->write_file_header)(cinfo);
  cinfo->next_scanline = 0;
  cinfo->global_state = 0x67;
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_coefficients (j_compress_ptr cinfo, jvirt_barray_ptr * coef_arrays)
{
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Mark all tables to be written */
  jpeg_suppress_tables(cinfo, FALSE);
  /* (Re)initialize error mgr and destination modules */
  (*cinfo->err->reset_error_mgr) ((j_common_ptr) cinfo);
  (*cinfo->dest->init_destination) (cinfo);
  /* Perform master selection of active modules */
  transencode_master_selection(cinfo, coef_arrays);
  /* Wait for jpeg_finish_compress() call */
  cinfo->next_scanline = 0;	/* so jpeg_write_marker works */
  cinfo->global_state = CSTATE_WRCOEFS;
}